

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O2

int socket_bytes_available(int socket)

{
  int iVar1;
  int n;
  
  iVar1 = ioctl(socket,0x541b);
  if (iVar1 < 0) {
    n = -1;
  }
  else {
    n = 0;
  }
  return n;
}

Assistant:

int socket_bytes_available(int socket)
{
#ifdef _WIN32
    u_long n = 0;
    if (ioctlsocket(socket, FIONREAD, &n) != NO_ERROR)
        return -1;
    return n;
#else
    int n = 0;
    if (ioctl(socket, FIONREAD, &n) < 0)
        return -1;
    return n;
#endif
}